

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

string * __thiscall
args::FlagBase::GetNameString_abi_cxx11_
          (string *__return_storage_ptr__,FlagBase *this,HelpParams *params)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  long extraout_RDX;
  EitherFlag *this_00;
  vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> flagStrings;
  string postfix;
  vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((params->showValueName == true) &&
     (iVar2 = (*(this->super_NamedBase).super_Base._vptr_Base[0x13])(this),
     extraout_RDX != 0 || CONCAT44(extraout_var,iVar2) != 0)) {
    (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(&local_90,this);
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Matcher::GetFlagStrings(&local_b8,&this->matcher);
  lVar3 = (long)local_b8.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_b8.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>.
                _M_impl.super__Vector_impl_data._M_start;
  bVar1 = params->useValueNameOnce;
  local_98 = &params->valueOpen;
  local_a0 = &params->valueClose;
  this_00 = local_b8.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl
            .super__Vector_impl_data._M_start;
  while (this_00 !=
         local_b8.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    if (this_00 !=
        local_b8.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    EitherFlag::str_abi_cxx11_(&local_70,this_00);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = this_00 + 1;
    if ((local_90._M_string_length != 0) &&
       ((this_00 !=
         local_b8.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl.
         super__Vector_impl_data._M_finish & lVar3 != 0x28 & bVar1) == 0)) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::operator+(&local_50,local_98,&local_90);
      std::operator+(&local_70,&local_50,local_a0);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::~vector(&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetNameString(const HelpParams &params) const override
            {
                const std::string postfix = !params.showValueName || NumberOfArguments() == 0 ? std::string() : Name();
                std::string flags;
                const auto flagStrings = matcher.GetFlagStrings();
                const bool useValueNameOnce = flagStrings.size() == 1 ? false : params.useValueNameOnce;
                for (auto it = flagStrings.begin(); it != flagStrings.end(); ++it)
                {
                    auto &flag = *it;
                    if (it != flagStrings.begin())
                    {
                        flags += ", ";
                    }

                    flags += flag.isShort ? params.shortPrefix : params.longPrefix;
                    flags += flag.str();

                    if (!postfix.empty() && (!useValueNameOnce || it + 1 == flagStrings.end()))
                    {
                        flags += flag.isShort ? params.shortSeparator : params.longSeparator;
                        flags += params.valueOpen + postfix + params.valueClose;
                    }
                }

                return flags;
            }